

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weighted_digraph.h
# Opt level: O2

WeightedDigraph<int,_int> * __thiscall
data_structures::WeightedDigraph<int,_int>::addEdge
          (WeightedDigraph<int,_int> *this,int *v,int *w,int weight)

{
  RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *this_00;
  size_t *psVar1;
  bool bVar2;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar3;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *node;
  
  if (*v != *w) {
    this_00 = &(this->super_WeightedGraph<int,_int>)._tree;
    pRVar3 = RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::getNode(this_00,v);
    node = RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::getNode(this_00,w);
    bVar2 = WeightedGraphAdjSet<int,_int>::addEdge(&(pRVar3->element).value,node,weight);
    if (bVar2) {
      psVar1 = &(this->super_WeightedGraph<int,_int>)._edge_count;
      *psVar1 = *psVar1 + 1;
    }
  }
  return this;
}

Assistant:

inline
    WeightedDigraph<T, Weight>& WeightedDigraph<T, Weight>::addEdge(const T& v, const T& w, Weight weight){
        if (v == w) {
            return *this;
        }
        auto vp = this->_tree.getNode(v);
        auto wp = this->_tree.getNode(w);
        if (vp->element.value.addEdge(wp, weight)) {
            this->_edge_count++;
        }
        return *this;
    }